

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_stream.c
# Opt level: O1

void ResizeIfNeeded(MemoryStream *memory_stream,size_t minimum_needed_size)

{
  ulong uVar1;
  ulong __size;
  uchar *puVar2;
  
  uVar1 = memory_stream->size;
  if (memory_stream->size < minimum_needed_size) {
    do {
      __size = uVar1;
      uVar1 = __size * 2;
    } while (__size < minimum_needed_size);
    puVar2 = (uchar *)realloc(memory_stream->buffer,__size);
    memory_stream->buffer = puVar2;
    memset(puVar2 + memory_stream->size,0,__size - memory_stream->size);
    memory_stream->size = __size;
  }
  if (memory_stream->end < minimum_needed_size) {
    memory_stream->end = minimum_needed_size;
  }
  return;
}

Assistant:

static void ResizeIfNeeded(MemoryStream *memory_stream, size_t minimum_needed_size)
{
	if (minimum_needed_size > memory_stream->size)
	{
		size_t new_size = memory_stream->size;
		while (new_size < minimum_needed_size)
			new_size <<= 1;

		memory_stream->buffer = (unsigned char*)realloc(memory_stream->buffer, new_size);
		memset(memory_stream->buffer + memory_stream->size, 0, new_size - memory_stream->size);
		memory_stream->size = new_size;
	}

	if (minimum_needed_size > memory_stream->end)
		memory_stream->end = minimum_needed_size;
}